

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_build_forward_impl(ggml_cgraph *cgraph,ggml_tensor *tensor,_Bool expand)

{
  byte in_DL;
  ggml_cgraph *in_RSI;
  int *in_RDI;
  int n_new;
  int n0;
  int iVar1;
  undefined3 in_stack_ffffffffffffffec;
  
  if ((in_DL & 1) == 0) {
    *in_RDI = 0;
    in_RDI[1] = 0;
  }
  iVar1 = *in_RDI;
  ggml_visit_parents(in_RSI,(ggml_tensor *)
                            (CONCAT44(CONCAT13(in_DL,in_stack_ffffffffffffffec),iVar1) &
                            0x1ffffffffffffff));
  if ((0 < *in_RDI - iVar1) && (*(ggml_cgraph **)(in_RDI + (long)(*in_RDI + -1) * 2 + 8) != in_RSI))
  {
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x2350,
            "cgraph->nodes[cgraph->n_nodes - 1] == tensor");
    abort();
  }
  return;
}

Assistant:

static void ggml_build_forward_impl(struct ggml_cgraph * cgraph, struct ggml_tensor * tensor, bool expand) {
    if (!expand) {
        cgraph->n_nodes = 0;
        cgraph->n_leafs = 0;
    }

    const int n0 = cgraph->n_nodes;
    UNUSED(n0);

    ggml_visit_parents(cgraph, tensor);

    const int n_new = cgraph->n_nodes - n0;
    GGML_PRINT_DEBUG("%s: visited %d new nodes\n", __func__, n_new);

    if (n_new > 0) {
        // the last added node should always be starting point
        GGML_ASSERT(cgraph->nodes[cgraph->n_nodes - 1] == tensor);
    }
}